

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ResolveOrderGroupBy(Parse *pParse,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  ExprList *pEList_00;
  ExprList_item *local_50;
  ExprList_item *pItem;
  ExprList *pEList;
  sqlite3 *db;
  int i;
  char *zType_local;
  ExprList *pOrderBy_local;
  Select *pSelect_local;
  Parse *pParse_local;
  
  if ((pOrderBy == (ExprList *)0x0) || (pParse->db->mallocFailed != '\0')) {
    pParse_local._4_4_ = 0;
  }
  else if (pParse->db->aLimit[2] < pOrderBy->nExpr) {
    sqlite3ErrorMsg(pParse,"too many terms in %s BY clause",zType);
    pParse_local._4_4_ = 1;
  }
  else {
    pEList_00 = pSelect->pEList;
    local_50 = pOrderBy->a;
    for (db._4_4_ = 0; db._4_4_ < pOrderBy->nExpr; db._4_4_ = db._4_4_ + 1) {
      if ((local_50->u).x.iOrderByCol != 0) {
        if (pEList_00->nExpr < (int)(uint)(local_50->u).x.iOrderByCol) {
          resolveOutOfRangeError(pParse,zType,db._4_4_ + 1,pEList_00->nExpr);
          return 1;
        }
        resolveAlias(pParse,pEList_00,(local_50->u).x.iOrderByCol - 1,local_50->pExpr,zType,0);
      }
      local_50 = local_50 + 1;
    }
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveOrderGroupBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect,      /* The SELECT statement containing the clause */
  ExprList *pOrderBy,   /* The ORDER BY or GROUP BY clause to be processed */
  const char *zType     /* "ORDER" or "GROUP" */
){
  int i;
  sqlite3 *db = pParse->db;
  ExprList *pEList;
  struct ExprList_item *pItem;

  if( pOrderBy==0 || pParse->db->mallocFailed ) return 0;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in %s BY clause", zType);
    return 1;
  }
  pEList = pSelect->pEList;
  assert( pEList!=0 );  /* sqlite3SelectNew() guarantees this */
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    if( pItem->u.x.iOrderByCol ){
      if( pItem->u.x.iOrderByCol>pEList->nExpr ){
        resolveOutOfRangeError(pParse, zType, i+1, pEList->nExpr);
        return 1;
      }
      resolveAlias(pParse, pEList, pItem->u.x.iOrderByCol-1, pItem->pExpr,
                   zType,0);
    }
  }
  return 0;
}